

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod.c
# Opt level: O0

uint32_t checkAddr(char *addrStr)

{
  uint32_t uVar1;
  char *in_RDI;
  uint32_t addr;
  char *portStr;
  sockaddr_in *sin;
  addrinfo *res;
  addrinfo hints;
  int err;
  char *local_60;
  addrinfo *local_50;
  addrinfo local_48;
  int local_14;
  char *local_10;
  uint32_t local_4;
  
  local_10 = in_RDI;
  local_60 = getenv("PIGPIO_PORT");
  if (local_60 == (char *)0x0) {
    local_60 = "8888";
  }
  memset(&local_48,0,0x30);
  local_48.ai_family = 2;
  local_48.ai_socktype = 1;
  local_48.ai_flags = local_48.ai_flags | 2;
  local_14 = getaddrinfo(local_10,local_60,&local_48,&local_50);
  if (local_14 == 0) {
    uVar1 = *(uint32_t *)(local_50->ai_addr->sa_data + 2);
    freeaddrinfo(local_50);
    local_4 = uVar1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static uint32_t checkAddr(char *addrStr)
{
   int err;
   struct addrinfo hints, *res;
   struct sockaddr_in *sin;
   const char *portStr;
   uint32_t addr;

   portStr = getenv(PI_ENVPORT);

   if (!portStr) portStr = PI_DEFAULT_SOCKET_PORT_STR;

   memset (&hints, 0, sizeof (hints));

   hints.ai_family   = AF_INET;
   hints.ai_socktype = SOCK_STREAM;
   hints.ai_flags   |= AI_CANONNAME;

   err = getaddrinfo(addrStr, portStr, &hints, &res);

   if (err) return 0;

   sin = (struct sockaddr_in *)res->ai_addr;
   addr = sin->sin_addr.s_addr;

   freeaddrinfo(res);

   return addr;
}